

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O2

int check_matrix_entry(SUNMatrix A,realtype val,realtype tol)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  lVar2 = SUNDenseMatrix_Data();
  uVar3 = SUNDenseMatrix_LData(A);
  uVar7 = 0;
  if ((long)uVar3 < 1) {
    uVar3 = uVar7;
  }
  for (uVar4 = 0; iVar6 = (int)uVar7, uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = *(double *)(lVar2 + uVar4 * 8);
    uVar5 = 1;
    if (!NAN(dVar1)) {
      uVar5 = (uint)(tol < ABS((dVar1 - val) / val));
    }
    uVar7 = (ulong)(iVar6 + uVar5);
  }
  if (iVar6 != 0) {
    puts("Check_matrix_entry failures:");
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      dVar1 = *(double *)(lVar2 + uVar7 * 8);
      if ((NAN(dVar1)) || (tol < ABS((dVar1 - val) / val))) {
        printf("  Adata[%ld] = %g != %g (err = %g)\n",dVar1,val,ABS(dVar1 - val),uVar7);
      }
    }
  }
  return (int)(iVar6 != 0);
}

Assistant:

int check_matrix_entry(SUNMatrix A, realtype val, realtype tol)
{
  int failure = 0;
  realtype *Adata;
  sunindextype Aldata;
  sunindextype i;
  
  /* get data pointer */
  Adata = SUNDenseMatrix_Data(A);

  /* compare data */
  Aldata = SUNDenseMatrix_LData(A);
  for(i=0; i < Aldata; i++){
    failure += FNEQ(Adata[i], val, tol);
  }

  if (failure > ZERO) {
    printf("Check_matrix_entry failures:\n");
    for(i=0; i < Aldata; i++)
      if (FNEQ(Adata[i], val, tol) != 0)
        printf("  Adata[%ld] = %g != %g (err = %g)\n", (long int) i,
               Adata[i], val, SUNRabs(Adata[i]-val));
  }
  
  if (failure > ZERO)
    return(1);
  else
    return(0);
}